

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pending_with_parameters.cpp
# Opt level: O2

void CheckSimpleQueryAfterModification(Connection *con)

{
  undefined1 uVar1;
  bool bVar2;
  initializer_list<duckdb::Value> __l;
  initializer_list<duckdb::Value> __l_00;
  allocator_type local_121;
  _Head_base<0UL,_duckdb::PendingQueryResult_*,_false> local_120;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_118;
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_c8;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_b8;
  vector<duckdb::Value,_true> values;
  StringRef local_88 [4];
  StringRef local_48;
  StringRef local_38;
  
  duckdb::Value::Value((Value *)&catchAssertionHandler,0xe);
  __l._M_len = 1;
  __l._M_array = (iterator)&catchAssertionHandler;
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            (&values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>,__l,
             (allocator_type *)local_88);
  duckdb::Value::~Value((Value *)&catchAssertionHandler);
  std::__cxx11::string::string
            ((string *)&catchAssertionHandler,"SELECT COUNT(*) FROM a WHERE i=?",
             (allocator *)local_88);
  duckdb::Connection::PendingQuery
            ((string *)&local_120,(vector *)con,SUB81(&catchAssertionHandler,0));
  std::__cxx11::string::~string((string *)&catchAssertionHandler);
  local_88[0].m_start = "REQUIRE";
  local_88[0].m_size = 7;
  local_c8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_pending_with_parameters.cpp"
  ;
  local_c8.line = 0x33;
  Catch::StringRef::StringRef(&local_38,"!pending_result->HasError()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,local_88,&local_c8,local_38,Normal);
  duckdb::
  unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>::
  operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
              *)&local_120);
  uVar1 = duckdb::BaseQueryResult::HasError();
  local_88[0].m_start = (char *)(CONCAT71(local_88[0].m_start._1_7_,uVar1) ^ 1);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  duckdb::
  unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>::
  operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
              *)&local_120);
  duckdb::PendingQueryResult::Execute();
  local_88[0].m_start = "REQUIRE";
  local_88[0].m_size = 7;
  local_c8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_pending_with_parameters.cpp"
  ;
  local_c8.line = 0x35;
  Catch::StringRef::StringRef(&local_48,"CHECK_COLUMN(result, 0, {1})");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,local_88,&local_c8,local_48,Normal);
  duckdb::Value::Value((Value *)local_88,1);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_88;
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector(&local_b8,__l_00,&local_121);
  bVar2 = duckdb::CHECK_COLUMN
                    ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                      *)&local_118,0,(vector<duckdb::Value,_true> *)&local_b8);
  local_c8.file = (char *)CONCAT71(local_c8.file._1_7_,bVar2);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_c8);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_b8);
  duckdb::Value::~Value((Value *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  if (local_118._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)local_118._M_head_impl + 8))();
  }
  if (local_120._M_head_impl != (PendingQueryResult *)0x0) {
    (**(code **)(*(long *)local_120._M_head_impl + 8))();
  }
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            (&values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
  return;
}

Assistant:

static void CheckSimpleQueryAfterModification(Connection &con) {
	duckdb::vector<Value> values = {Value(14)};
	auto pending_result = con.PendingQuery("SELECT COUNT(*) FROM a WHERE i=?", values, true);
	REQUIRE(!pending_result->HasError());
	auto result = pending_result->Execute();
	REQUIRE(CHECK_COLUMN(result, 0, {1}));
}